

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# geometry.cpp
# Opt level: O2

Stream * rw::writeMaterialRights
                   (Stream *stream,int32 param_2,void *object,int32 param_4,int32 param_5)

{
  undefined8 local_10;
  
  local_10 = **(undefined8 **)((long)object + 0x18);
  Stream::write32(stream,&local_10,8);
  return stream;
}

Assistant:

static Stream*
writeMaterialRights(Stream *stream, int32, void *object, int32, int32)
{
	Material *material = (Material*)object;
	uint32 buffer[2];
	buffer[0] = material->pipeline->pluginID;
	buffer[1] = material->pipeline->pluginData;
	stream->write32(buffer, 8);
	return stream;
}